

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

mecab_node_t * __thiscall
MeCab::Tokenizer<mecab_node_t,_mecab_path_t>::lookup<true>
          (Tokenizer<mecab_node_t,_mecab_path_t> *this,char *begin,char *end,
          Allocator<mecab_node_t,_mecab_path_t> *allocator,Lattice *lattice)

{
  size_t sVar1;
  Dictionary *pDVar2;
  pointer ppVar3;
  char *pcVar4;
  short sVar5;
  short sVar6;
  Allocator<mecab_node_t,_mecab_path_t> *pAVar7;
  Lattice *pLVar8;
  bool bVar9;
  unsigned_short uVar10;
  int iVar11;
  CharInfo CVar12;
  CharInfo CVar13;
  uint uVar14;
  CharInfo CVar15;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  mecab_node_t *pmVar16;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ostream *poVar17;
  pointer ppDVar18;
  result_pair_type *prVar19;
  uint *puVar20;
  result_pair_type *prVar21;
  size_t sVar22;
  Tokenizer<mecab_node_t,_mecab_path_t> *pTVar23;
  ulong uVar24;
  result_pair_type *prVar25;
  long lVar26;
  undefined1 auVar27 [16];
  size_t mblen;
  mecab_node_t *local_c0;
  die local_a9;
  uint *local_a8;
  Tokenizer<mecab_node_t,_mecab_path_t> *local_a0;
  result_pair_type *local_98;
  long local_90;
  size_t local_88;
  Allocator<mecab_node_t,_mecab_path_t> *local_80;
  char *local_78;
  result_pair_type *local_70;
  Lattice *local_68;
  result_pair_type *local_60;
  CharProperty *local_58;
  undefined8 local_50;
  size_t local_48;
  size_t local_40;
  ulong local_38;
  
  local_88 = 0;
  prVar19 = (result_pair_type *)(begin + 0xffff);
  if ((ulong)((long)end - (long)begin) < 0xffff) {
    prVar19 = (result_pair_type *)end;
  }
  local_80 = allocator;
  iVar11 = (*lattice->_vptr_Lattice[8])(lattice);
  uVar24 = (long)begin - CONCAT44(extraout_var,iVar11);
  do {
    uVar24 = uVar24 + 1;
    iVar11 = (*lattice->_vptr_Lattice[0xb])(lattice);
    if (CONCAT44(extraout_var_00,iVar11) <= uVar24) goto LAB_00125ebe;
    iVar11 = (*lattice->_vptr_Lattice[0x1f])(lattice,uVar24);
  } while (iVar11 != 1);
  iVar11 = (*lattice->_vptr_Lattice[8])(lattice);
  prVar19 = (result_pair_type *)(CONCAT44(extraout_var_01,iVar11) + uVar24);
LAB_00125ebe:
  local_58 = &this->property_;
  local_78 = begin;
  if (prVar19 == (result_pair_type *)begin) {
    CVar12 = (CharInfo)0x0;
  }
  else {
    CVar15 = this->space_;
    do {
      CVar12 = CharProperty::getCharInfo(local_58,begin,(char *)prVar19,&local_88);
      if (((uint)CVar15 & (uint)CVar12 & 0x3ffff) == 0) break;
      begin = (char *)((long)&((result_pair_type *)begin)->value + local_88);
      CVar15 = CVar12;
    } while ((result_pair_type *)begin != prVar19);
  }
  ppDVar18 = (this->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_a0 = this;
  local_70 = prVar19;
  local_68 = lattice;
  if (ppDVar18 ==
      (this->dic_).super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_c0 = (mecab_node_t *)0x0;
  }
  else {
    prVar25 = (local_80->results_).ptr_;
    local_50 = (long)prVar19 - (long)begin;
    local_90 = (long)begin - (long)local_78;
    local_98 = (result_pair_type *)CONCAT44(local_98._4_4_,(uint)CVar12 >> 0x12);
    local_c0 = (mecab_node_t *)0x0;
    local_60 = prVar25;
    do {
      local_48 = Darts::
                 DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::
                 commonPrefixSearch<MeCab::Darts::DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>::result_pair_type>
                           ((DoubleArrayImpl<char,unsigned_char,int,unsigned_int,MeCab::Darts::Length<char>>
                             *)&(*ppDVar18)->da_,begin,prVar25,0x200,local_50,0);
      if (local_48 != 0) {
        sVar22 = 0;
        do {
          uVar14 = prVar25[sVar22].value;
          local_40 = sVar22;
          if ((uVar14 & 0xff) != 0) {
            local_a8 = &(*ppDVar18)->token_[(int)uVar14 >> 8].feature;
            uVar24 = 0;
            do {
              pAVar7 = local_80;
              pmVar16 = FreeList<mecab_node_t>::alloc((local_80->node_freelist_).ptr_);
              pmVar16->prev = (mecab_node_t *)0x0;
              pmVar16->next = (mecab_node_t *)0x0;
              pmVar16->enext = (mecab_node_t *)0x0;
              pmVar16->bnext = (mecab_node_t *)0x0;
              pmVar16->rpath = (mecab_path_t *)0x0;
              pmVar16->lpath = (mecab_path_t *)0x0;
              pmVar16->surface = (char *)0x0;
              pmVar16->feature = (char *)0x0;
              pmVar16->id = 0;
              pmVar16->length = 0;
              pmVar16->rlength = 0;
              pmVar16->rcAttr = 0;
              pmVar16->lcAttr = 0;
              pmVar16->posid = 0;
              pmVar16->char_type = '\0';
              pmVar16->stat = '\0';
              pmVar16->isbest = '\0';
              *(undefined3 *)&pmVar16->field_0x51 = 0;
              pmVar16->alpha = 0.0;
              pmVar16->beta = 0.0;
              pmVar16->prob = 0.0;
              *(undefined8 *)&pmVar16->wcost = 0;
              pmVar16->cost = 0;
              sVar1 = pAVar7->id_;
              pAVar7->id_ = sVar1 + 1;
              pmVar16->id = (uint)sVar1;
              pDVar2 = *ppDVar18;
              auVar27 = ZEXT416(*(uint *)((long)local_a8 + (uVar24 - 8)));
              auVar27 = pshuflw(auVar27,auVar27,0xe1);
              pmVar16->rcAttr = (short)auVar27._0_4_;
              pmVar16->lcAttr = (short)((uint)auVar27._0_4_ >> 0x10);
              pmVar16->posid = *(unsigned_short *)((long)local_a8 + (uVar24 - 4));
              pmVar16->wcost = *(short *)((long)local_a8 + (uVar24 - 2));
              pmVar16->feature = pDVar2->feature_ + *(uint *)((long)local_a8 + uVar24);
              uVar10 = (unsigned_short)prVar25[sVar22].length;
              pmVar16->length = uVar10;
              pmVar16->rlength = uVar10 + (short)local_90;
              pmVar16->surface = begin;
              pmVar16->stat = '\0';
              pmVar16->char_type = (uchar)local_98;
              bVar9 = anon_unknown_21::is_valid_node<mecab_node_t>(local_68,pmVar16);
              if (bVar9) {
                pmVar16->bnext = local_c0;
                local_c0 = pmVar16;
              }
              uVar24 = uVar24 + 0x10;
            } while ((uVar14 & 0xff) << 4 != uVar24);
          }
          sVar22 = local_40 + 1;
          prVar25 = local_60;
        } while (sVar22 != local_48);
      }
      ppDVar18 = ppDVar18 + 1;
    } while (ppDVar18 !=
             (local_a0->dic_).
             super__Vector_base<MeCab::Dictionary_*,_std::allocator<MeCab::Dictionary_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (((int)CVar12 < 0) || (local_c0 == (mecab_node_t *)0x0)) {
    local_a8 = (uint *)local_88;
    prVar19 = (result_pair_type *)((long)&((result_pair_type *)begin)->value + local_88);
    if (local_70 < prVar19) {
      ppVar3 = (local_a0->unk_tokens_).
               super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar24 = (ulong)((uint)CVar12 >> 0xe & 0xff0);
      lVar26 = *(long *)((long)&ppVar3->second + uVar24);
      local_98 = prVar19;
      if (lVar26 != 0) {
        local_90 = CONCAT44(local_90._4_4_,(uint)CVar12 >> 0x12);
        sVar5 = (short)local_78;
        puVar20 = (uint *)(*(long *)((long)&ppVar3->first + uVar24) + 8);
        do {
          pAVar7 = local_80;
          pmVar16 = FreeList<mecab_node_t>::alloc((local_80->node_freelist_).ptr_);
          pmVar16->prev = (mecab_node_t *)0x0;
          pmVar16->next = (mecab_node_t *)0x0;
          pmVar16->enext = (mecab_node_t *)0x0;
          pmVar16->bnext = (mecab_node_t *)0x0;
          pmVar16->rpath = (mecab_path_t *)0x0;
          pmVar16->lpath = (mecab_path_t *)0x0;
          pmVar16->surface = (char *)0x0;
          pmVar16->feature = (char *)0x0;
          pmVar16->id = 0;
          pmVar16->length = 0;
          pmVar16->rlength = 0;
          pmVar16->rcAttr = 0;
          pmVar16->lcAttr = 0;
          pmVar16->posid = 0;
          pmVar16->char_type = '\0';
          pmVar16->stat = '\0';
          pmVar16->isbest = '\0';
          *(undefined3 *)&pmVar16->field_0x51 = 0;
          pmVar16->alpha = 0.0;
          pmVar16->beta = 0.0;
          pmVar16->prob = 0.0;
          pmVar16->wcost = 0;
          *(undefined6 *)&pmVar16->field_0x62 = 0;
          pmVar16->cost = 0;
          sVar22 = pAVar7->id_;
          pAVar7->id_ = sVar22 + 1;
          pmVar16->id = (uint)sVar22;
          auVar27 = pshuflw(ZEXT416(puVar20[-2]),ZEXT416(puVar20[-2]),0xe1);
          pmVar16->rcAttr = (short)auVar27._0_4_;
          pmVar16->lcAttr = (short)((uint)auVar27._0_4_ >> 0x10);
          pmVar16->posid = (unsigned_short)puVar20[-1];
          pmVar16->wcost = *(short *)((long)puVar20 + -2);
          pmVar16->feature = (local_a0->unkdic_).feature_ + *puVar20;
          pmVar16->char_type = (uchar)local_90;
          pmVar16->surface = begin;
          pmVar16->length = (unsigned_short)local_a8;
          pmVar16->rlength = (short)prVar19 - sVar5;
          pmVar16->stat = '\x01';
          pmVar16->bnext = local_c0;
          pcVar4 = (local_a0->unk_feature_).super_scoped_array<char>.ptr_;
          if (pcVar4 != (char *)0x0) {
            pmVar16->feature = pcVar4;
          }
          bVar9 = anon_unknown_21::is_valid_node<mecab_node_t>(local_68,pmVar16);
          if (bVar9) {
            local_c0 = pmVar16;
          }
          puVar20 = puVar20 + 4;
          lVar26 = lVar26 + -1;
        } while (lVar26 != 0);
      }
      if (local_c0 != (mecab_node_t *)0x0) {
        return local_c0;
      }
      local_c0 = (mecab_node_t *)0x0;
      prVar19 = local_98;
    }
    prVar25 = local_70;
    pTVar23 = local_a0;
    iVar11 = (int)begin;
    if (((uint)CVar12 >> 0x1e & 1) == 0) {
      prVar21 = (result_pair_type *)0x0;
    }
    else {
      local_98 = prVar19;
      if (prVar19 == local_70) {
        uVar24 = 0;
        prVar21 = prVar19;
      }
      else {
        uVar24 = 0;
        CVar15 = CVar12;
        do {
          CVar13 = CharProperty::getCharInfo(local_58,(char *)prVar19,(char *)prVar25,&local_88);
          prVar21 = prVar19;
          if (((uint)CVar15 & (uint)CVar13 & 0x3ffff) == 0) break;
          prVar19 = (result_pair_type *)((long)&prVar19->value + local_88);
          uVar24 = uVar24 + 1;
          prVar21 = prVar19;
          CVar15 = CVar13;
        } while (prVar19 != prVar25);
      }
      prVar19 = local_98;
      if (uVar24 <= pTVar23->max_grouping_size_) {
        ppVar3 = (pTVar23->unk_tokens_).
                 super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar24 = (ulong)((uint)CVar12 >> 0xe & 0xff0);
        lVar26 = *(long *)((long)&ppVar3->second + uVar24);
        if (lVar26 != 0) {
          local_a8 = (uint *)CONCAT44(local_a8._4_4_,(uint)CVar12 >> 0x12);
          local_90 = CONCAT44(local_90._4_4_,(int)prVar21 - iVar11);
          sVar6 = (short)local_78;
          sVar5 = (short)prVar21;
          puVar20 = (uint *)(*(long *)((long)&ppVar3->first + uVar24) + 8);
          local_60 = prVar21;
          do {
            pAVar7 = local_80;
            pmVar16 = FreeList<mecab_node_t>::alloc((local_80->node_freelist_).ptr_);
            pmVar16->prev = (mecab_node_t *)0x0;
            pmVar16->next = (mecab_node_t *)0x0;
            pmVar16->enext = (mecab_node_t *)0x0;
            pmVar16->bnext = (mecab_node_t *)0x0;
            pmVar16->rpath = (mecab_path_t *)0x0;
            pmVar16->lpath = (mecab_path_t *)0x0;
            pmVar16->surface = (char *)0x0;
            pmVar16->feature = (char *)0x0;
            pmVar16->id = 0;
            pmVar16->length = 0;
            pmVar16->rlength = 0;
            pmVar16->rcAttr = 0;
            pmVar16->lcAttr = 0;
            pmVar16->posid = 0;
            pmVar16->char_type = '\0';
            pmVar16->stat = '\0';
            pmVar16->isbest = '\0';
            *(undefined3 *)&pmVar16->field_0x51 = 0;
            pmVar16->alpha = 0.0;
            pmVar16->beta = 0.0;
            pmVar16->prob = 0.0;
            pmVar16->wcost = 0;
            *(undefined6 *)&pmVar16->field_0x62 = 0;
            pmVar16->cost = 0;
            sVar22 = pAVar7->id_;
            pAVar7->id_ = sVar22 + 1;
            pmVar16->id = (uint)sVar22;
            auVar27 = pshuflw(ZEXT416(puVar20[-2]),ZEXT416(puVar20[-2]),0xe1);
            pmVar16->rcAttr = (short)auVar27._0_4_;
            pmVar16->lcAttr = (short)((uint)auVar27._0_4_ >> 0x10);
            pmVar16->posid = (unsigned_short)puVar20[-1];
            pmVar16->wcost = *(short *)((long)puVar20 + -2);
            pmVar16->feature = (local_a0->unkdic_).feature_ + *puVar20;
            pmVar16->char_type = (uchar)local_a8;
            pmVar16->surface = begin;
            pmVar16->length = (unsigned_short)local_90;
            pmVar16->rlength = sVar5 - sVar6;
            pmVar16->stat = '\x01';
            pmVar16->bnext = local_c0;
            pcVar4 = (local_a0->unk_feature_).super_scoped_array<char>.ptr_;
            if (pcVar4 != (char *)0x0) {
              pmVar16->feature = pcVar4;
            }
            bVar9 = anon_unknown_21::is_valid_node<mecab_node_t>(local_68,pmVar16);
            if (bVar9) {
              local_c0 = pmVar16;
            }
            puVar20 = puVar20 + 4;
            lVar26 = lVar26 + -1;
            prVar21 = local_60;
            pTVar23 = local_a0;
            prVar19 = local_98;
            prVar25 = local_70;
          } while (lVar26 != 0);
        }
      }
    }
    uVar14 = (uint)CVar12 >> 0x1a & 0xf;
    local_48 = (size_t)uVar14;
    if ((uVar14 != 0) && (prVar19 <= prVar25)) {
      local_90 = CONCAT44(local_90._4_4_,(uint)CVar12 >> 0x12);
      local_50 = CONCAT44(local_50._4_4_,CVar12) & 0xffffffff0003ffff;
      sVar22 = 1;
      uVar24 = (ulong)(((uint)CVar12 >> 0x12 & 0xff) << 4);
      local_60 = prVar21;
      local_38 = uVar24;
      do {
        if (prVar19 != prVar21) {
          ppVar3 = (pTVar23->unk_tokens_).
                   super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          lVar26 = *(long *)((long)&ppVar3->second + uVar24);
          local_98 = prVar19;
          local_40 = sVar22;
          if (lVar26 != 0) {
            local_a8 = (uint *)CONCAT44(local_a8._4_4_,(int)prVar19 - iVar11);
            sVar5 = (short)local_78;
            puVar20 = (uint *)(*(long *)((long)&ppVar3->first + uVar24) + 8);
            do {
              pAVar7 = local_80;
              pmVar16 = FreeList<mecab_node_t>::alloc((local_80->node_freelist_).ptr_);
              pmVar16->prev = (mecab_node_t *)0x0;
              pmVar16->next = (mecab_node_t *)0x0;
              pmVar16->enext = (mecab_node_t *)0x0;
              pmVar16->bnext = (mecab_node_t *)0x0;
              pmVar16->rpath = (mecab_path_t *)0x0;
              pmVar16->lpath = (mecab_path_t *)0x0;
              pmVar16->surface = (char *)0x0;
              pmVar16->feature = (char *)0x0;
              pmVar16->id = 0;
              pmVar16->length = 0;
              pmVar16->rlength = 0;
              pmVar16->rcAttr = 0;
              pmVar16->lcAttr = 0;
              pmVar16->posid = 0;
              pmVar16->char_type = '\0';
              pmVar16->stat = '\0';
              pmVar16->isbest = '\0';
              *(undefined3 *)&pmVar16->field_0x51 = 0;
              pmVar16->alpha = 0.0;
              pmVar16->beta = 0.0;
              pmVar16->prob = 0.0;
              pmVar16->wcost = 0;
              *(undefined6 *)&pmVar16->field_0x62 = 0;
              pmVar16->cost = 0;
              sVar22 = pAVar7->id_;
              pAVar7->id_ = sVar22 + 1;
              pmVar16->id = (uint)sVar22;
              auVar27 = pshuflw(ZEXT416(puVar20[-2]),ZEXT416(puVar20[-2]),0xe1);
              pmVar16->rcAttr = (short)auVar27._0_4_;
              pmVar16->lcAttr = (short)((uint)auVar27._0_4_ >> 0x10);
              pmVar16->posid = (unsigned_short)puVar20[-1];
              pmVar16->wcost = *(short *)((long)puVar20 + -2);
              pmVar16->feature = (local_a0->unkdic_).feature_ + *puVar20;
              pmVar16->char_type = (uchar)local_90;
              pmVar16->surface = begin;
              pmVar16->length = (unsigned_short)local_a8;
              pmVar16->rlength = (short)prVar19 - sVar5;
              pmVar16->stat = '\x01';
              pmVar16->bnext = local_c0;
              pcVar4 = (local_a0->unk_feature_).super_scoped_array<char>.ptr_;
              if (pcVar4 != (char *)0x0) {
                pmVar16->feature = pcVar4;
              }
              bVar9 = anon_unknown_21::is_valid_node<mecab_node_t>(local_68,pmVar16);
              if (bVar9) {
                local_c0 = pmVar16;
              }
              puVar20 = puVar20 + 4;
              lVar26 = lVar26 + -1;
            } while (lVar26 != 0);
          }
          prVar19 = local_98;
          CVar15 = CharProperty::getCharInfo(local_58,(char *)local_98,(char *)local_70,&local_88);
          if (((uint)local_50 & (uint)CVar15) == 0) break;
          prVar19 = (result_pair_type *)((long)&prVar19->value + local_88);
          sVar22 = local_40;
          uVar24 = local_38;
          prVar21 = local_60;
          pTVar23 = local_a0;
          prVar25 = local_70;
        }
        if ((local_48 <= sVar22) || (sVar22 = sVar22 + 1, prVar25 < prVar19)) break;
      } while( true );
    }
    pLVar8 = local_68;
    if (local_c0 == (mecab_node_t *)0x0) {
      ppVar3 = (local_a0->unk_tokens_).
               super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar24 = (ulong)((uint)CVar12 >> 0xe & 0xff0);
      lVar26 = *(long *)((long)&ppVar3->second + uVar24);
      if (lVar26 == 0) {
        local_c0 = (mecab_node_t *)0x0;
      }
      else {
        local_a8 = (uint *)CONCAT44(local_a8._4_4_,(int)prVar19 - iVar11);
        local_98 = (result_pair_type *)(ulong)(uint)((int)prVar19 - (int)local_78);
        puVar20 = (uint *)(*(long *)((long)&ppVar3->first + uVar24) + 8);
        local_c0 = (mecab_node_t *)0x0;
        do {
          pAVar7 = local_80;
          pmVar16 = FreeList<mecab_node_t>::alloc((local_80->node_freelist_).ptr_);
          pmVar16->prev = (mecab_node_t *)0x0;
          pmVar16->next = (mecab_node_t *)0x0;
          pmVar16->enext = (mecab_node_t *)0x0;
          pmVar16->bnext = (mecab_node_t *)0x0;
          pmVar16->rpath = (mecab_path_t *)0x0;
          pmVar16->lpath = (mecab_path_t *)0x0;
          pmVar16->surface = (char *)0x0;
          pmVar16->feature = (char *)0x0;
          pmVar16->id = 0;
          pmVar16->length = 0;
          pmVar16->rlength = 0;
          pmVar16->rcAttr = 0;
          pmVar16->lcAttr = 0;
          pmVar16->posid = 0;
          pmVar16->char_type = '\0';
          pmVar16->stat = '\0';
          pmVar16->isbest = '\0';
          *(undefined3 *)&pmVar16->field_0x51 = 0;
          pmVar16->alpha = 0.0;
          pmVar16->beta = 0.0;
          pmVar16->prob = 0.0;
          pmVar16->wcost = 0;
          *(undefined6 *)&pmVar16->field_0x62 = 0;
          pmVar16->cost = 0;
          sVar22 = pAVar7->id_;
          pAVar7->id_ = sVar22 + 1;
          pmVar16->id = (uint)sVar22;
          auVar27 = pshuflw(ZEXT416(puVar20[-2]),ZEXT416(puVar20[-2]),0xe1);
          pmVar16->rcAttr = (short)auVar27._0_4_;
          pmVar16->lcAttr = (short)((uint)auVar27._0_4_ >> 0x10);
          pmVar16->posid = (unsigned_short)puVar20[-1];
          pmVar16->wcost = *(short *)((long)puVar20 + -2);
          pmVar16->feature = (local_a0->unkdic_).feature_ + *puVar20;
          pmVar16->char_type = (uchar)((uint)CVar12 >> 0x12);
          pmVar16->surface = begin;
          pmVar16->length = (unsigned_short)local_a8;
          pmVar16->rlength = (unsigned_short)local_98;
          pmVar16->stat = '\x01';
          pmVar16->bnext = local_c0;
          pcVar4 = (local_a0->unk_feature_).super_scoped_array<char>.ptr_;
          if (pcVar4 != (char *)0x0) {
            pmVar16->feature = pcVar4;
          }
          bVar9 = anon_unknown_21::is_valid_node<mecab_node_t>(pLVar8,pmVar16);
          if (bVar9) {
            local_c0 = pmVar16;
          }
          puVar20 = puVar20 + 4;
          lVar26 = lVar26 + -1;
        } while (lVar26 != 0);
      }
    }
    if (local_c0 == (mecab_node_t *)0x0) {
      prVar19 = (result_pair_type *)begin;
      do {
        CVar12 = CharProperty::getCharInfo(local_58,(char *)prVar19,(char *)local_70,&local_88);
        prVar19 = (result_pair_type *)((long)&prVar19->value + local_88);
        if (local_70 < prVar19) break;
        iVar11 = (*pLVar8->_vptr_Lattice[8])(pLVar8);
        iVar11 = (*pLVar8->_vptr_Lattice[0x1f])
                           (pLVar8,(long)prVar19 - CONCAT44(extraout_var_02,iVar11));
      } while (iVar11 == 2);
      local_a8 = (uint *)CONCAT44(local_a8._4_4_,(uint)CVar12 >> 0x12);
      ppVar3 = (local_a0->unk_tokens_).
               super__Vector_base<std::pair<const_MeCab::Token_*,_unsigned_long>,_std::allocator<std::pair<const_MeCab::Token_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar24 = (ulong)((uint)CVar12 >> 0xe & 0xff0);
      lVar26 = *(long *)((long)&ppVar3->second + uVar24);
      sVar5 = (short)prVar19;
      if (lVar26 == 0) {
        local_c0 = (mecab_node_t *)0x0;
      }
      else {
        local_90 = CONCAT44(local_90._4_4_,(int)prVar19 - (int)local_78);
        puVar20 = (uint *)(*(long *)((long)&ppVar3->first + uVar24) + 8);
        local_c0 = (mecab_node_t *)0x0;
        do {
          pAVar7 = local_80;
          pmVar16 = FreeList<mecab_node_t>::alloc((local_80->node_freelist_).ptr_);
          pmVar16->prev = (mecab_node_t *)0x0;
          pmVar16->next = (mecab_node_t *)0x0;
          pmVar16->enext = (mecab_node_t *)0x0;
          pmVar16->bnext = (mecab_node_t *)0x0;
          pmVar16->rpath = (mecab_path_t *)0x0;
          pmVar16->lpath = (mecab_path_t *)0x0;
          pmVar16->surface = (char *)0x0;
          pmVar16->feature = (char *)0x0;
          pmVar16->id = 0;
          pmVar16->length = 0;
          pmVar16->rlength = 0;
          pmVar16->rcAttr = 0;
          pmVar16->lcAttr = 0;
          pmVar16->posid = 0;
          pmVar16->char_type = '\0';
          pmVar16->stat = '\0';
          pmVar16->isbest = '\0';
          *(undefined3 *)&pmVar16->field_0x51 = 0;
          pmVar16->alpha = 0.0;
          pmVar16->beta = 0.0;
          pmVar16->prob = 0.0;
          pmVar16->wcost = 0;
          *(undefined6 *)&pmVar16->field_0x62 = 0;
          pmVar16->cost = 0;
          sVar22 = pAVar7->id_;
          pAVar7->id_ = sVar22 + 1;
          pmVar16->id = (uint)sVar22;
          auVar27 = pshuflw(ZEXT416(puVar20[-2]),ZEXT416(puVar20[-2]),0xe1);
          pmVar16->rcAttr = (short)auVar27._0_4_;
          pmVar16->lcAttr = (short)((uint)auVar27._0_4_ >> 0x10);
          pmVar16->posid = (unsigned_short)puVar20[-1];
          pmVar16->wcost = *(short *)((long)puVar20 + -2);
          pmVar16->feature = (local_a0->unkdic_).feature_ + *puVar20;
          pmVar16->char_type = (uchar)local_a8;
          pmVar16->surface = begin;
          pmVar16->length = sVar5 - (short)begin;
          pmVar16->rlength = (unsigned_short)local_90;
          pmVar16->stat = '\x01';
          pmVar16->bnext = local_c0;
          pcVar4 = (local_a0->unk_feature_).super_scoped_array<char>.ptr_;
          if (pcVar4 != (char *)0x0) {
            pmVar16->feature = pcVar4;
          }
          bVar9 = anon_unknown_21::is_valid_node<mecab_node_t>(local_68,pmVar16);
          if (bVar9) {
            local_c0 = pmVar16;
          }
          puVar20 = puVar20 + 4;
          lVar26 = lVar26 + -1;
        } while (lVar26 != 0);
      }
      pLVar8 = local_68;
      pAVar7 = local_80;
      if (local_c0 == (mecab_node_t *)0x0) {
        local_c0 = FreeList<mecab_node_t>::alloc((local_80->node_freelist_).ptr_);
        pcVar4 = local_78;
        local_c0->prev = (mecab_node_t *)0x0;
        local_c0->next = (mecab_node_t *)0x0;
        local_c0->enext = (mecab_node_t *)0x0;
        local_c0->bnext = (mecab_node_t *)0x0;
        local_c0->rpath = (mecab_path_t *)0x0;
        local_c0->lpath = (mecab_path_t *)0x0;
        local_c0->surface = (char *)0x0;
        local_c0->feature = (char *)0x0;
        local_c0->id = 0;
        local_c0->length = 0;
        local_c0->rlength = 0;
        local_c0->rcAttr = 0;
        local_c0->lcAttr = 0;
        local_c0->posid = 0;
        local_c0->char_type = '\0';
        local_c0->stat = '\0';
        local_c0->isbest = '\0';
        *(undefined3 *)&local_c0->field_0x51 = 0;
        local_c0->alpha = 0.0;
        local_c0->beta = 0.0;
        local_c0->prob = 0.0;
        local_c0->wcost = 0;
        *(undefined6 *)&local_c0->field_0x62 = 0;
        local_c0->cost = 0;
        sVar22 = pAVar7->id_;
        pAVar7->id_ = sVar22 + 1;
        local_c0->id = (uint)sVar22;
        local_c0->char_type = (uchar)local_a8;
        local_c0->surface = begin;
        local_c0->length = sVar5 - (short)begin;
        local_c0->rlength = sVar5 - (short)local_78;
        local_c0->stat = '\x01';
        local_c0->bnext = (mecab_node_t *)0x0;
        iVar11 = (*pLVar8->_vptr_Lattice[8])(pLVar8);
        iVar11 = (*pLVar8->_vptr_Lattice[0x20])
                           (pLVar8,(long)pcVar4 - CONCAT44(extraout_var_03,iVar11));
        local_c0->feature = (char *)CONCAT44(extraout_var_04,iVar11);
        if ((char *)CONCAT44(extraout_var_04,iVar11) == (char *)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/open_jtalk-1.11/mecab/src/tokenizer.cpp"
                     ,0x6f);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"(",1);
          poVar17 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x171);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,") [",3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"new_node->feature",0x11);
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"] ",2);
          die::~die(&local_a9);
        }
      }
    }
  }
  return local_c0;
}

Assistant:

N *Tokenizer<N, P>::lookup(const char *begin, const char *end,
                           Allocator<N, P> *allocator, Lattice *lattice) const {
  CharInfo cinfo;
  N *result_node = 0;
  size_t mblen = 0;
  size_t clen = 0;

  end = static_cast<size_t>(end - begin) >= 65535 ? begin + 65535 : end;

  if (isPartial) {
    const size_t begin_pos = begin - lattice->sentence();
    for (size_t n = begin_pos + 1; n < lattice->size(); ++n) {
      if (lattice->boundary_constraint(n) == MECAB_TOKEN_BOUNDARY) {
        end = lattice->sentence() + n;
        break;
      }
    }
  }

  const char *begin2 = property_.seekToOtherType(begin, end, space_,
                                                 &cinfo, &mblen, &clen);

  Dictionary::result_type *daresults = allocator->mutable_results();
  const size_t results_size = allocator->results_size();

  for (std::vector<Dictionary *>::const_iterator it = dic_.begin();
       it != dic_.end(); ++it) {
    const size_t n = (*it)->commonPrefixSearch(
        begin2,
        static_cast<size_t>(end - begin2),
        daresults, results_size);

    for (size_t i = 0; i < n; ++i) {
      size_t size = (*it)->token_size(daresults[i]);
      const Token *token = (*it)->token(daresults[i]);
      for (size_t j = 0; j < size; ++j) {
        N *new_node = allocator->newNode();
        read_node_info(**it, *(token + j), &new_node);
        new_node->length = daresults[i].length;
        new_node->rlength = begin2 - begin + new_node->length;
        new_node->surface = begin2;
        new_node->stat = MECAB_NOR_NODE;
        new_node->char_type = cinfo.default_type;
        if (isPartial && !is_valid_node(lattice, new_node)) {
          continue;
        }
        new_node->bnext = result_node;
        result_node = new_node;
      }
    }
  }

  if (result_node && !cinfo.invoke) {
    return result_node;
  }

  const char *begin3 = begin2 + mblen;
  const char *group_begin3 = 0;

  if (begin3 > end) {
    ADDUNKNWON;
    if (result_node) {
    return result_node;
  }
  }

  if (cinfo.group) {
    const char *tmp = begin3;
    CharInfo fail;
    begin3 = property_.seekToOtherType(begin3, end, cinfo,
                                       &fail, &mblen, &clen);
    if (clen <= max_grouping_size_) {
      ADDUNKNWON;
    }
    group_begin3 = begin3;
    begin3 = tmp;
  }

  for (size_t i = 1; i <= cinfo.length; ++i) {
    if (begin3 > end) {
      break;
    }
    if (begin3 == group_begin3) {
      continue;
    }
    clen = i;
    ADDUNKNWON;
    if (!cinfo.isKindOf(property_.getCharInfo(begin3, end, &mblen))) {
      break;
    }
    begin3 += mblen;
  }

  if (!result_node) {
    ADDUNKNWON;
  }

  if (isPartial && !result_node) {
    begin3 = begin2;
    while (true) {
      cinfo = property_.getCharInfo(begin3, end, &mblen);
      begin3 += mblen;
      if (begin3 > end ||
          lattice->boundary_constraint(begin3 - lattice->sentence())
          != MECAB_INSIDE_TOKEN) {
        break;
      }
    }
    ADDUNKNWON;

    if (!result_node) {
      N *new_node = allocator->newNode();
      new_node->char_type = cinfo.default_type;
      new_node->surface = begin2;
      new_node->length = begin3 - begin2;
      new_node->rlength = begin3 - begin;
      new_node->stat = MECAB_UNK_NODE;
      new_node->bnext = result_node;
      new_node->feature =
          lattice->feature_constraint(begin - lattice->sentence());
      CHECK_DIE(new_node->feature);
      result_node = new_node;
    }
  }

  return result_node;
}